

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O2

FT_Error BDF_Glyph_Load(FT_GlyphSlot slot,FT_Size size,FT_UInt glyph_index,FT_Int32 load_flags)

{
  undefined2 uVar1;
  ushort uVar2;
  ushort uVar3;
  int iVar4;
  FT_Face pFVar5;
  long lVar6;
  FT_Byte *buffer;
  FT_Error FVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  
  pFVar5 = size->face;
  if (glyph_index < (uint)pFVar5->num_glyphs) {
    uVar1 = *(undefined2 *)(pFVar5[1].face_flags + 0x880f2);
    if (glyph_index == 0) {
      uVar9 = pFVar5[1].num_fixed_sizes;
    }
    else {
      uVar9 = glyph_index - 1;
    }
    lVar6 = *(long *)(pFVar5[1].face_flags + 0x60);
    lVar8 = (ulong)uVar9 * 0x38;
    uVar2 = *(ushort *)(lVar6 + 0x12 + lVar8);
    uVar3 = *(ushort *)(lVar6 + 0x14 + lVar8);
    iVar10 = (int)*(short *)(lVar6 + 0x18 + lVar8);
    iVar11 = (int)*(short *)(lVar6 + 0x1c + lVar8);
    buffer = *(FT_Byte **)(lVar6 + 0x20 + lVar8);
    iVar4 = *(int *)(lVar6 + 0x28 + lVar8);
    (slot->bitmap).rows = (uint)*(ushort *)(lVar6 + 0x16 + lVar8);
    (slot->bitmap).width = (uint)uVar3;
    (slot->bitmap).pitch = iVar4;
    ft_glyphslot_set_bitmap(slot,buffer);
    switch(uVar1) {
    case 1:
      (slot->bitmap).pixel_mode = '\x01';
      break;
    case 2:
      (slot->bitmap).pixel_mode = '\x03';
      break;
    case 4:
      (slot->bitmap).pixel_mode = '\x04';
      break;
    case 8:
      (slot->bitmap).pixel_mode = '\x02';
      (slot->bitmap).num_grays = 0x100;
    }
    slot->format = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = iVar10;
    slot->bitmap_top = iVar11;
    (slot->metrics).horiAdvance = (ulong)uVar2 << 6;
    (slot->metrics).horiBearingX = (long)iVar10 << 6;
    (slot->metrics).horiBearingY = (long)iVar11 << 6;
    (slot->metrics).width = (ulong)((slot->bitmap).width << 6);
    (slot->metrics).height = (ulong)((slot->bitmap).rows << 6);
    ft_synthesize_vertical_metrics
              (&slot->metrics,(ulong)*(ushort *)(pFVar5[1].face_flags + 10) << 6);
    FVar7 = 0;
  }
  else {
    FVar7 = 6;
  }
  return FVar7;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Glyph_Load( FT_GlyphSlot  slot,
                  FT_Size       size,
                  FT_UInt       glyph_index,
                  FT_Int32      load_flags )
  {
    BDF_Face     bdf    = (BDF_Face)FT_SIZE_FACE( size );
    FT_Face      face   = FT_FACE( bdf );
    FT_Error     error  = FT_Err_Ok;
    FT_Bitmap*   bitmap = &slot->bitmap;
    bdf_glyph_t  glyph;
    int          bpp    = bdf->bdffont->bpp;

    FT_UNUSED( load_flags );


    if ( !face )
    {
      error = FT_THROW( Invalid_Face_Handle );
      goto Exit;
    }

    if ( glyph_index >= (FT_UInt)face->num_glyphs )
    {
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    FT_TRACE1(( "BDF_Glyph_Load: glyph index %d\n", glyph_index ));

    /* index 0 is the undefined glyph */
    if ( glyph_index == 0 )
      glyph_index = bdf->default_glyph;
    else
      glyph_index--;

    /* slot, bitmap => freetype, glyph => bdflib */
    glyph = bdf->bdffont->glyphs[glyph_index];

    bitmap->rows  = glyph.bbx.height;
    bitmap->width = glyph.bbx.width;
    if ( glyph.bpr > FT_INT_MAX )
      FT_TRACE1(( "BDF_Glyph_Load: too large pitch %d is truncated\n",
                   glyph.bpr ));
    bitmap->pitch = (int)glyph.bpr; /* same as FT_Bitmap.pitch */

    /* note: we don't allocate a new array to hold the bitmap; */
    /*       we can simply point to it                         */
    ft_glyphslot_set_bitmap( slot, glyph.bitmap );

    switch ( bpp )
    {
    case 1:
      bitmap->pixel_mode = FT_PIXEL_MODE_MONO;
      break;
    case 2:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY2;
      break;
    case 4:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY4;
      break;
    case 8:
      bitmap->pixel_mode = FT_PIXEL_MODE_GRAY;
      bitmap->num_grays  = 256;
      break;
    }

    slot->format      = FT_GLYPH_FORMAT_BITMAP;
    slot->bitmap_left = glyph.bbx.x_offset;
    slot->bitmap_top  = glyph.bbx.ascent;

    slot->metrics.horiAdvance  = (FT_Pos)( glyph.dwidth * 64 );
    slot->metrics.horiBearingX = (FT_Pos)( glyph.bbx.x_offset * 64 );
    slot->metrics.horiBearingY = (FT_Pos)( glyph.bbx.ascent * 64 );
    slot->metrics.width        = (FT_Pos)( bitmap->width * 64 );
    slot->metrics.height       = (FT_Pos)( bitmap->rows * 64 );

    /*
     * XXX DWIDTH1 and VVECTOR should be parsed and
     * used here, provided such fonts do exist.
     */
    ft_synthesize_vertical_metrics( &slot->metrics,
                                    bdf->bdffont->bbx.height * 64 );

  Exit:
    return error;
  }